

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QShaderDescription::InOutVariable>::relocate
          (QArrayDataPointer<QShaderDescription::InOutVariable> *this,qsizetype offset,
          InOutVariable **data)

{
  bool bVar1;
  char *n;
  InOutVariable *in_RDX;
  long in_RSI;
  InOutVariable *in_RDI;
  InOutVariable **unaff_retaddr;
  InOutVariable *res;
  InOutVariable *c;
  
  n = (in_RDI->name).d.ptr + in_RSI * 0x68;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QShaderDescription::InOutVariable,long_long>
            (in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (InOutVariable *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QShaderDescription::InOutVariable>,QShaderDescription::InOutVariable_const*>
                        (unaff_retaddr,(QArrayDataPointer<QShaderDescription::InOutVariable> *)c),
     bVar1)) {
    (in_RDX->name).d.d = (Data *)(in_RSI * 0x68 + (long)(in_RDX->name).d.d);
  }
  (in_RDI->name).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }